

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

bool __thiscall
glcts::GeometryShaderMaxTextureUnitsTest::verifyResult
          (GeometryShaderMaxTextureUnitsTest *this,void *data)

{
  int iVar1;
  reference pvVar2;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  MessageBuilder local_1e0;
  int *local_60;
  GLint *result_value;
  uint local_50;
  uint texel_offset;
  uint x;
  uint first_texel_offset;
  uint line_offset;
  uint y;
  uint point_offset;
  GLint expected_value;
  GLint last_value;
  GLint first_value;
  GLint point;
  uint line_size;
  uchar *result_image;
  void *data_local;
  GeometryShaderMaxTextureUnitsTest *this_local;
  
  first_value = this->m_texture_width << 4;
  last_value = 0;
  _point = data;
  result_image = (uchar *)data;
  data_local = this;
  do {
    if (this->m_max_texture_units <= last_value) {
      return true;
    }
    pvVar2 = std::
             vector<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
             ::operator[](&this->m_textures,0);
    expected_value = pvVar2->data;
    pvVar2 = std::
             vector<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
             ::operator[](&this->m_textures,(long)last_value);
    point_offset = pvVar2->data;
    y = (int)((expected_value + point_offset) * (last_value + 1)) / 2;
    line_offset = last_value << 5;
    for (first_texel_offset = 0; first_texel_offset < 2; first_texel_offset = first_texel_offset + 1
        ) {
      x = first_texel_offset * first_value;
      texel_offset = x + line_offset;
      for (local_50 = 0; local_50 < 2; local_50 = local_50 + 1) {
        result_value._4_4_ = texel_offset + local_50 * 0x10;
        iVar1 = memcmp((void *)((long)_point + (ulong)result_value._4_4_),&y,4);
        if (iVar1 != 0) {
          local_60 = (int *)((long)_point + (ulong)result_value._4_4_);
          this_00 = tcu::TestContext::getLog
                              ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.
                               super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_1e0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar3 = tcu::MessageBuilder::operator<<
                             (&local_1e0,(char (*) [25])"Wrong result! Expected: ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)&y);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [13])" Extracted: ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_60);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [9])" Point: ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&last_value);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])0x2b02228);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_50);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])0x2ae6b61);
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&first_texel_offset);
          tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_1e0);
          return false;
        }
      }
    }
    last_value = last_value + 1;
  } while( true );
}

Assistant:

bool GeometryShaderMaxTextureUnitsTest::verifyResult(const void* data)
{
	const unsigned char* result_image = (const unsigned char*)data;
	const unsigned int   line_size	= m_texture_width * m_texture_pixel_size;

	/* For each drawn point */
	for (glw::GLint point = 0; point < m_max_texture_units; ++point)
	{
		const glw::GLint   first_value	= m_textures[0].data;
		const glw::GLint   last_value	 = m_textures[point].data;
		const glw::GLint   expected_value = ((first_value + last_value) * (point + 1)) / 2;
		const unsigned int point_offset   = point * m_texture_pixel_size * m_point_size;

		/* Verify all pixels that belong to point, area m_point_size x m_point_size */
		for (unsigned int y = 0; y < m_point_size; ++y)
		{
			const unsigned int line_offset		  = y * line_size;
			const unsigned int first_texel_offset = line_offset + point_offset;

			for (unsigned int x = 0; x < m_point_size; ++x)
			{
				const unsigned int texel_offset = first_texel_offset + x * m_texture_pixel_size;

				if (0 != memcmp(result_image + texel_offset, &expected_value, sizeof(expected_value)))
				{
					glw::GLint* result_value = (glw::GLint*)(result_image + texel_offset);

					m_testCtx.getLog() << tcu::TestLog::Message << "Wrong result! "
																   "Expected: "
									   << expected_value << " Extracted: " << *result_value << " Point: " << point
									   << " X: " << x << " Y: " << y << tcu::TestLog::EndMessage;

					return false;
				}
			}
		}
	}

	return true;
}